

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O2

int Cbs0_ManPropagate(Cbs0_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t **ppGVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  long lVar8;
  long lVar9;
  
  do {
    for (lVar9 = (long)(p->pProp).iHead;
        (iVar4 = (p->pProp).iTail, lVar9 < iVar4 &&
        (pGVar7 = (p->pProp).pData[lVar9], pGVar7 != (Gia_Obj_t *)0x0)); lVar9 = lVar9 + 1) {
      if (((ulong)pGVar7 & 1) != 0) {
        __assert_fail("!Gia_IsComplement(pVar)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                      ,0x1d4,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
      }
      uVar3 = (uint)*(undefined8 *)pGVar7;
      if ((uVar3 >> 0x1e & 1) == 0) {
        __assert_fail("Cbs0_VarIsAssigned(pVar)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                      ,0x1d5,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
      }
      if ((~uVar3 & 0x9fffffff) != 0) {
        if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                        ,0x1d8,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
        }
        iVar4 = Cbs0_VarFanin0Value(pGVar7);
        iVar5 = Cbs0_VarFanin1Value(pGVar7);
        iVar6 = Cbs0_VarValue(pGVar7);
        if (iVar6 == 0) {
          if (iVar5 != 0 && iVar4 != 0) {
            if (iVar5 == 1 && iVar4 == 1) {
              return 1;
            }
            if (iVar4 == 1 || iVar5 == 1) {
              if (iVar4 == 2) {
                Cbs0_ManAssign(p,(Gia_Obj_t *)
                                 (((ulong)((uint)*(undefined8 *)pGVar7 >> 0x1d & 1) |
                                  (ulong)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff
                                                           ))) ^ 1));
              }
              if (iVar5 == 2) {
                pGVar7 = Gia_ObjChild1(pGVar7);
                pGVar7 = (Gia_Obj_t *)((ulong)pGVar7 ^ 1);
                goto LAB_005bb072;
              }
            }
            else {
              iVar4 = Cbs0_VarIsJust(pGVar7);
              if (iVar4 == 0) {
                __assert_fail("Cbs0_VarIsJust(pVar)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                              ,0x1f2,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
              }
              lVar8 = (long)(p->pJust).iHead;
              while ((lVar8 < (p->pJust).iTail &&
                     (pGVar1 = (p->pJust).pData[lVar8], pGVar1 != (Gia_Obj_t *)0x0))) {
                lVar8 = lVar8 + 1;
                if (pGVar1 == pGVar7) {
                  __assert_fail("!Cbs0_QueHasNode( &p->pJust, pVar )",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                                ,499,"int Cbs0_ManPropagateOne(Cbs0_Man_t *, Gia_Obj_t *)");
                }
              }
              Cbs0_QuePush(&p->pJust,pGVar7);
            }
          }
        }
        else {
          if (iVar5 == 0 || iVar4 == 0) {
            return 1;
          }
          if (iVar4 == 2) {
            Cbs0_ManAssign(p,(Gia_Obj_t *)
                             ((ulong)((uint)*(undefined8 *)pGVar7 >> 0x1d & 1) |
                             (ulong)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff))));
          }
          if (iVar5 == 2) {
            pGVar7 = Gia_ObjChild1(pGVar7);
LAB_005bb072:
            Cbs0_ManAssign(p,pGVar7);
          }
        }
      }
    }
    (p->pProp).iHead = iVar4;
    iVar4 = (p->pJust).iHead;
    for (lVar9 = (long)iVar4; iVar5 = (p->pJust).iTail, lVar9 < iVar5; lVar9 = lVar9 + 1) {
      ppGVar2 = (p->pJust).pData;
      pGVar7 = ppGVar2[lVar9];
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      iVar5 = Cbs0_VarIsJust(pGVar7);
      if (iVar5 == 0) {
        if (((ulong)pGVar7 & 1) != 0) {
          __assert_fail("!Gia_IsComplement(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                        ,0x206,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
        }
        uVar3 = (uint)*(undefined8 *)pGVar7;
        if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                        ,0x207,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
        }
        if ((uVar3 >> 0x1e & 1) == 0) {
          __assert_fail("Cbs0_VarIsAssigned(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                        ,0x208,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
        }
        iVar5 = Cbs0_VarValue(pGVar7);
        if (iVar5 != 0) {
          __assert_fail("!Cbs0_VarValue(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                        ,0x209,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
        }
        iVar5 = Cbs0_VarFanin0Value(pGVar7);
        iVar6 = Cbs0_VarFanin1Value(pGVar7);
        if (iVar6 != 0 && iVar5 != 0) {
          if (iVar6 == 1 && iVar5 == 1) {
            return 1;
          }
          if (iVar5 != 1 && iVar6 != 1) {
            __assert_fail("Value0 == 1 || Value1 == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSatOld.c"
                          ,0x211,"int Cbs0_ManPropagateTwo(Cbs0_Man_t *, Gia_Obj_t *)");
          }
          if (iVar5 == 2) {
            Cbs0_ManAssign(p,(Gia_Obj_t *)
                             (((ulong)((uint)*(undefined8 *)pGVar7 >> 0x1d & 1) |
                              (ulong)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)))
                             ^ 1));
          }
          if (iVar6 == 2) {
            pGVar7 = Gia_ObjChild1(pGVar7);
            Cbs0_ManAssign(p,(Gia_Obj_t *)((ulong)pGVar7 ^ 1));
          }
        }
      }
      else {
        lVar8 = (long)iVar4;
        iVar4 = iVar4 + 1;
        ppGVar2[lVar8] = pGVar7;
      }
    }
    if (iVar4 == iVar5) {
      return 0;
    }
    (p->pJust).iTail = iVar4;
  } while( true );
}

Assistant:

int Cbs0_ManPropagate( Cbs0_Man_t * p )
{
    Gia_Obj_t * pVar;
    int i, k;
    while ( 1 )
    {
        Cbs0_QueForEachEntry( p->pProp, pVar, i )
        {
            if ( Cbs0_ManPropagateOne( p, pVar ) )
                return 1;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Cbs0_QueForEachEntry( p->pJust, pVar, i )
        {
            if ( Cbs0_VarIsJust( pVar ) )
                p->pJust.pData[k++] = pVar;
            else if ( Cbs0_ManPropagateTwo( p, pVar ) )
                return 1;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
    return 0;
}